

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O3

void __thiscall SimpleStrategy::process(SimpleStrategy *this)

{
  ofstream *poVar1;
  _Rb_tree_header *p_Var2;
  CFG *pCVar3;
  Addr addr;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  char cVar13;
  bool bVar14;
  const_iterator __position;
  ostream *poVar15;
  long *plVar16;
  _Base_ptr p_Var17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  int iVar21;
  Report r;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> bCFGs;
  int local_208;
  int local_1e8;
  int iStack_1e4;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  Report local_1a8;
  int local_128;
  int iStack_124;
  undefined8 uStack_120;
  Report local_110;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_90;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_60;
  
  local_1a8._vptr_Report = (_func_int **)&PTR__Report_00117c58;
  local_1a8.matched._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  local_1a8.matched.cfgs = 0;
  local_1a8.matched.instrs = 0;
  local_1a8.matched.blocks = 0;
  local_1a8.matched.phantoms = 0;
  local_1a8.matched.edges = 0;
  local_1a8.matched.calls = 0;
  local_1a8.matched.indirects = 0;
  local_1a8.unmatched.a._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  local_1a8.unmatched.a.cfgs = 0;
  local_1a8.unmatched.a.instrs = 0;
  local_1a8.unmatched.a.blocks = 0;
  local_1a8.unmatched.a.phantoms = 0;
  local_1a8.unmatched.a.edges = 0;
  local_1a8.unmatched.a.calls = 0;
  local_1a8.unmatched.a.indirects = 0;
  local_1a8.unmatched.b._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  local_1a8.unmatched.b.cfgs = 0;
  local_1a8.unmatched.b.instrs = 0;
  local_1a8.unmatched.b.blocks = 0;
  local_1a8.unmatched.b.phantoms = 0;
  local_1a8.unmatched.b.edges = 0;
  local_1a8.unmatched.b.calls = 0;
  local_1a8.unmatched.b.indirects = 0;
  poVar1 = &(this->super_Strategy).m_fout;
  cVar13 = std::__basic_file<char>::is_open();
  if (cVar13 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"file,cfg,instrs,blocks,phantoms,edges,calls",0x2b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_90,
                      (this->super_Strategy).m_b);
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_60,
                      (this->super_Strategy).m_a);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var2 = &local_90._M_impl.super__Rb_tree_header;
    p_Var17 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pCVar3 = *(CFG **)(p_Var17 + 1);
      if (pCVar3->m_status == VALID) {
        addr = pCVar3->m_addr;
        bVar14 = Strategy::isAddrInRange(&this->super_Strategy,addr);
        __position._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        if (bVar14) {
          while (((_Rb_tree_header *)__position._M_node != p_Var2 &&
                 (*(Addr *)(*(long *)(__position._M_node + 1) + 8) != addr))) {
            __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          }
          if (((_Rb_tree_header *)__position._M_node == p_Var2) ||
             ((*(CFG **)(__position._M_node + 1))->m_status != VALID)) {
            if ((this->super_Strategy).m_config.both == false) {
              extractStats((Stats *)&local_110,this,pCVar3);
              iVar8 = local_110.matched.phantoms;
              iVar7 = local_110.matched.blocks;
              iVar6 = local_110.matched.cfgs;
              iVar5 = local_110.matched._vptr_Stats._4_4_;
              local_1a8.unmatched.a.cfgs =
                   local_1a8.unmatched.a.cfgs + (int)local_110.matched._vptr_Stats;
              local_1a8.unmatched.a.instrs =
                   local_1a8.unmatched.a.instrs + local_110.matched._vptr_Stats._4_4_;
              local_1a8.unmatched.a.blocks = local_1a8.unmatched.a.blocks + local_110.matched.cfgs;
              local_1a8.unmatched.a.phantoms =
                   local_1a8.unmatched.a.phantoms + local_110.matched.instrs;
              iVar4 = local_1a8.unmatched.a.calls;
              local_1a8.unmatched.a.edges = local_1a8.unmatched.a.edges + local_110.matched.blocks;
              local_1a8.unmatched.a.calls = iVar4 + local_110.matched.phantoms;
              local_1a8.unmatched.a.indirects =
                   local_1a8.unmatched.a.indirects + local_110.matched.edges;
              if ((this->super_Strategy).m_config.detailed == true) {
                *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) &
                     0xffffffb5 | 8;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6)
                ;
                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,": file A",8);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
                *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) &
                     0xffffffb5 | 2;
                operator<<((ostream *)&std::cout,(Stats *)&local_110);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
                std::ostream::put(-0x18);
                std::ostream::flush();
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
                std::ostream::put(-0x18);
                std::ostream::flush();
              }
              cVar13 = std::__basic_file<char>::is_open();
              if (cVar13 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"A,0x",4);
                lVar18 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
                *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) =
                     *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) & 0xffffffb5 | 8;
                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
                *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
                     *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 |
                     2;
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
                plVar16 = (long *)std::ostream::operator<<((ostream *)poVar15,iVar8);
                std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
                std::ostream::put((char)plVar16);
                std::ostream::flush();
              }
            }
          }
          else {
            compareCFGs(&local_110,this,pCVar3,*(CFG **)(__position._M_node + 1));
            iVar12 = local_110.unmatched.b.blocks;
            iVar11 = local_110.unmatched.b.instrs;
            iVar10 = local_110.unmatched.a.blocks;
            iVar9 = local_110.unmatched.a.instrs;
            iVar8 = local_110.matched.calls;
            iVar7 = local_110.matched.edges;
            iVar6 = local_110.matched.blocks;
            iVar5 = local_110.matched.instrs;
            local_1a8.matched.cfgs = local_1a8.matched.cfgs + local_110.matched.cfgs;
            local_1a8.matched.instrs = local_1a8.matched.instrs + local_110.matched.instrs;
            local_1a8.matched.blocks = local_1a8.matched.blocks + local_110.matched.blocks;
            local_1a8.matched.phantoms = local_1a8.matched.phantoms + local_110.matched.phantoms;
            iVar4 = local_1a8.matched.calls;
            local_1a8.matched.edges = local_1a8.matched.edges + local_110.matched.edges;
            local_1a8.matched.calls = iVar4 + local_110.matched.calls;
            local_1a8.matched.indirects = local_1a8.matched.indirects + local_110.matched.indirects;
            local_1a8.unmatched.a.cfgs = local_1a8.unmatched.a.cfgs + local_110.unmatched.a.cfgs;
            local_1a8.unmatched.a.instrs =
                 local_1a8.unmatched.a.instrs + local_110.unmatched.a.instrs;
            local_1a8.unmatched.a.blocks =
                 local_1a8.unmatched.a.blocks + local_110.unmatched.a.blocks;
            local_1a8.unmatched.a.phantoms =
                 local_1a8.unmatched.a.phantoms + local_110.unmatched.a.phantoms;
            iVar4 = local_1a8.unmatched.a.calls;
            iVar20 = local_110.unmatched.a.edges;
            local_1a8.unmatched.a.edges = local_1a8.unmatched.a.edges + iVar20;
            iVar21 = local_110.unmatched.a.calls;
            local_1a8.unmatched.a.calls = iVar4 + iVar21;
            local_1a8.unmatched.a.indirects =
                 local_1a8.unmatched.a.indirects + local_110.unmatched.a.indirects;
            local_1a8.unmatched.b.cfgs = local_1a8.unmatched.b.cfgs + local_110.unmatched.b.cfgs;
            local_1a8.unmatched.b.instrs =
                 local_1a8.unmatched.b.instrs + local_110.unmatched.b.instrs;
            local_1a8.unmatched.b.blocks =
                 local_1a8.unmatched.b.blocks + local_110.unmatched.b.blocks;
            local_1a8.unmatched.b.phantoms =
                 local_1a8.unmatched.b.phantoms + local_110.unmatched.b.phantoms;
            local_128 = local_110.unmatched.b.edges;
            iStack_124 = local_110.unmatched.b.calls;
            uStack_120 = 0;
            iVar4 = local_1a8.unmatched.b.calls;
            local_1a8.unmatched.b.edges = local_1a8.unmatched.b.edges + local_110.unmatched.b.edges;
            local_1a8.unmatched.b.calls = iVar4 + local_110.unmatched.b.calls;
            local_1a8.unmatched.b.indirects =
                 local_1a8.unmatched.b.indirects + local_110.unmatched.b.indirects;
            if ((this->super_Strategy).m_config.detailed == true) {
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 8;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6);
              poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              bVar14 = (this->super_Strategy).m_config.both != false;
              pcVar19 = ": both files";
              if (bVar14) {
                pcVar19 = "";
              }
              lVar18 = 0xc;
              if (bVar14) {
                lVar18 = 0;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar19,lVar18);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
              std::ostream::put((char)poVar15);
              std::ostream::flush();
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 2;
              operator<<((ostream *)&std::cout,&local_110);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
            }
            cVar13 = std::__basic_file<char>::is_open();
            if (cVar13 != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"both,0x",7);
              lVar18 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) & 0xffffffb5 | 8;
              poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
                   *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              plVar16 = (long *)std::ostream::operator<<((ostream *)poVar15,iVar8);
              std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
              std::ostream::put((char)plVar16);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"A,0x",4);
              lVar18 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) & 0xffffffb5 | 8;
              poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
                   *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              plVar16 = (long *)std::ostream::operator<<((ostream *)poVar15,iVar21);
              std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
              std::ostream::put((char)plVar16);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"B,0x",4);
              lVar18 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) & 0xffffffb5 | 8;
              poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
                   *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,local_128);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
              plVar16 = (long *)std::ostream::operator<<((ostream *)poVar15,iStack_124);
              std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
              std::ostream::put((char)plVar16);
              std::ostream::flush();
            }
            std::_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>::
            erase_abi_cxx11_((_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>
                              *)&local_90,__position);
          }
        }
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&local_60);
  if (((this->super_Strategy).m_config.both == false) &&
     (p_Var2 = &local_90._M_impl.super__Rb_tree_header,
     (_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)) {
    local_1d8 = local_1a8.unmatched.b.cfgs;
    iStack_1d4 = local_1a8.unmatched.b.instrs;
    iStack_1d0 = local_1a8.unmatched.b.blocks;
    iStack_1cc = local_1a8.unmatched.b.phantoms;
    local_1e8 = local_1a8.unmatched.b.edges;
    iStack_1e4 = local_1a8.unmatched.b.calls;
    local_208 = local_1a8.unmatched.b.indirects;
    p_Var17 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pCVar3 = *(CFG **)(p_Var17 + 1);
      if ((pCVar3->m_status == VALID) &&
         (bVar14 = Strategy::isAddrInRange(&this->super_Strategy,pCVar3->m_addr), bVar14)) {
        extractStats((Stats *)&local_110,this,pCVar3);
        iVar7 = local_110.matched.phantoms;
        iVar6 = local_110.matched.blocks;
        iVar5 = local_110.matched.cfgs;
        iVar4 = local_110.matched._vptr_Stats._4_4_;
        local_1d8 = local_1d8 + (int)local_110.matched._vptr_Stats;
        iStack_1d4 = iStack_1d4 + local_110.matched._vptr_Stats._4_4_;
        iStack_1d0 = iStack_1d0 + local_110.matched.cfgs;
        iStack_1cc = iStack_1cc + local_110.matched.instrs;
        iStack_1e4 = iStack_1e4 + local_110.matched.phantoms;
        local_1e8 = local_1e8 + local_110.matched.blocks;
        local_208 = local_208 + local_110.matched.edges;
        if ((this->super_Strategy).m_config.detailed == true) {
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,": file B",8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2
          ;
          operator<<((ostream *)&std::cout,(Stats *)&local_110);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
        }
        cVar13 = std::__basic_file<char>::is_open();
        if (cVar13 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"B,0x",4);
          lVar18 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
          *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) =
               *(uint *)(&(this->super_Strategy).field_0x80 + lVar18) & 0xffffffb5 | 8;
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
               *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
          plVar16 = (long *)std::ostream::operator<<((ostream *)poVar15,iVar7);
          std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
          std::ostream::put((char)plVar16);
          std::ostream::flush();
        }
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != p_Var2);
    local_1a8.unmatched.b.cfgs = local_1d8;
    local_1a8.unmatched.b.instrs = iStack_1d4;
    local_1a8.unmatched.b.blocks = iStack_1d0;
    local_1a8.unmatched.b.phantoms = iStack_1cc;
    local_1a8.unmatched.b.edges = local_1e8;
    local_1a8.unmatched.b.calls = iStack_1e4;
    local_1a8.unmatched.b.indirects = local_208;
  }
  if ((this->super_Strategy).m_config.detailed == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total:",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  operator<<((ostream *)&std::cout,&local_1a8);
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&local_90);
  return;
}

Assistant:

void SimpleStrategy::process() {
	SimpleStrategy::Report total;

	if (m_fout.is_open())
		m_fout << "file,cfg,instrs,blocks,phantoms,edges,calls" << std::endl;

	std::set<CFG*> bCFGs = m_b->cfgs();
	for (CFG* cfg : m_a->cfgs()) {
		if (cfg->status() != CFG::VALID)
			continue;

		Addr addr = cfg->addr();
		if (!this->isAddrInRange(addr))
			continue;

		std::set<CFG*>::iterator it = std::find_if(bCFGs.begin(), bCFGs.end(),
		             [addr](const CFG* tmp) -> bool { return tmp->addr() == addr; });
		if (it != bCFGs.end() && (*it)->status() == CFG::VALID) {
			SimpleStrategy::Report r = compareCFGs(cfg, *it);
			total.matched += r.matched;
			total.unmatched.a += r.unmatched.a;
			total.unmatched.b += r.unmatched.b;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << addr << (!m_config.both ? ": both files" : "") << std::endl;

				std::cout << std::dec;
				std::cout << r;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "both,0x" << std::hex << addr << std::dec
						<< "," << r.matched.instrs << "," << r.matched.blocks
						<< "," << r.matched.phantoms << "," << r.matched.edges
						<< "," << r.matched.calls << std::endl;
				m_fout << "A,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.a.instrs << "," << r.unmatched.a.blocks
						<< "," << r.unmatched.a.phantoms << "," << r.unmatched.a.edges
						<< "," << r.unmatched.a.calls << std::endl;
				m_fout << "B,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.b.instrs << "," << r.unmatched.b.blocks
						<< "," << r.unmatched.b.phantoms << "," << r.unmatched.b.edges
						<< "," << r.unmatched.b.calls << std::endl;
			}

			bCFGs.erase(it);
		} else {
			if (!m_config.both) {
				SimpleStrategy::Stats s = extractStats(cfg);
				total.unmatched.a += s;

				if (m_config.detailed) {
					std::cout << std::hex;
					std::cout << "CFG 0x" << addr << ": file A" << std::endl;

					std::cout << std::dec;
					std::cout << s << std::endl;
					std::cout << std::endl;
				}

				if (m_fout.is_open()) {
					m_fout << "A,0x" << std::hex << addr << std::dec
							<< "," << s.instrs << "," << s.blocks
							<< "," << s.phantoms << "," << s.edges
							<< "," << s.calls << std::endl;
				}
			}
		}
	}

	if (!m_config.both) {
		for (CFG* cfg : bCFGs) {
			if (cfg->status() != CFG::VALID)
				continue;

			Addr addr = cfg->addr();
			if (!this->isAddrInRange(addr))
				continue;

			SimpleStrategy::Stats s = extractStats(cfg);
			total.unmatched.b += s;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << cfg->addr() << ": file B" << std::endl;

				std::cout << std::dec;
				std::cout << s << std::endl;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "B,0x" << std::hex << cfg->addr() << std::dec
						<< "," << s.instrs << "," << s.blocks
						<< "," << s.phantoms << "," << s.edges
						<< "," << s.calls << std::endl;
			}
		}
	}

	if (m_config.detailed)
		std::cout << "Total:" << std::endl;
	std::cout << total;
}